

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::Begin(char *name,bool *p_open,ImVec2 *size_first_use,float bg_alpha_override,
                 ImGuiWindowFlags flags)

{
  bool bVar1;
  ImGuiWindowFlags flags_local;
  float bg_alpha_override_local;
  ImVec2 *size_first_use_local;
  bool *p_open_local;
  char *name_local;
  
  if ((((size_first_use->x != 0.0) || (NAN(size_first_use->x))) || (size_first_use->y != 0.0)) ||
     (NAN(size_first_use->y))) {
    SetNextWindowSize(size_first_use,4);
  }
  if (0.0 <= bg_alpha_override) {
    SetNextWindowBgAlpha(bg_alpha_override);
  }
  bVar1 = Begin(name,p_open,flags);
  return bVar1;
}

Assistant:

bool ImGui::Begin(const char* name, bool* p_open, const ImVec2& size_first_use, float bg_alpha_override, ImGuiWindowFlags flags)
{
    // Old API feature: we could pass the initial window size as a parameter. This was misleading because it only had an effect if the window didn't have data in the .ini file.
    if (size_first_use.x != 0.0f || size_first_use.y != 0.0f)
        SetNextWindowSize(size_first_use, ImGuiCond_FirstUseEver);

    // Old API feature: override the window background alpha with a parameter.
    if (bg_alpha_override >= 0.0f)
        SetNextWindowBgAlpha(bg_alpha_override);

    return Begin(name, p_open, flags);
}